

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrString.h
# Opt level: O1

string<unsigned_short> * __thiscall
irr::core::string<unsigned_short>::operator=
          (string<unsigned_short> *this,string<unsigned_short> *other)

{
  int iVar1;
  unsigned_short *puVar2;
  long lVar3;
  ulong uVar4;
  
  if (this != other) {
    if (this->array != (unsigned_short *)0x0) {
      operator_delete__(this->array);
    }
    iVar1 = other->used;
    this->used = iVar1;
    this->allocated = iVar1;
    uVar4 = 0xffffffffffffffff;
    if (-1 < (long)iVar1) {
      uVar4 = (long)iVar1 * 2;
    }
    puVar2 = (unsigned_short *)operator_new__(uVar4);
    this->array = puVar2;
    if (0 < this->used) {
      puVar2 = other->array;
      lVar3 = 0;
      do {
        this->array[lVar3] = puVar2[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar3 < this->used);
    }
  }
  return this;
}

Assistant:

string<T>& operator=(const string<T>& other) 
	{
		if (this == &other)
			return *this;

		delete [] array;
		allocated = used = other.size()+1;
		array = new T[used];

		const T* p = other.c_str();
		for (s32 i=0; i<used; ++i, ++p)
			array[i] = *p;

		return *this;
	}